

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void vkt::sr::anon_unknown_0::eval_maxVecScalar_uvec3(ShaderEvalContext *c)

{
  float fVar1;
  int i;
  uint uVar2;
  long lVar3;
  int i_1;
  uint uVar4;
  Vector<unsigned_int,_3> res;
  Vector<unsigned_int,_3> res_1;
  Vector<float,_3> res_2;
  float local_24;
  undefined8 local_20;
  int aiStack_18 [6];
  
  local_24 = c->in[0].m_data[2];
  local_20 = *(undefined8 *)c->in[0].m_data;
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  res.m_data[2] = 0;
  lVar3 = 0;
  do {
    res.m_data[lVar3] = (uint)(long)(&local_24)[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  fVar1 = c->in[1].m_data[0];
  res_1.m_data[2] = 0;
  res_1.m_data[0] = 0;
  res_1.m_data[1] = 0;
  lVar3 = 0;
  do {
    uVar2 = (uint)(long)fVar1;
    uVar4 = res.m_data[lVar3];
    if (res.m_data[lVar3] <= uVar2) {
      uVar4 = uVar2;
    }
    res_1.m_data[lVar3] = uVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  res_2.m_data[2] = 0.0;
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  lVar3 = 0;
  do {
    res_2.m_data[lVar3] = (float)res_1.m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar3 = 2;
  do {
    (c->color).m_data[aiStack_18[lVar3]] = (float)res_1.m_data[lVar3 + 2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }